

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O2

void __thiscall
spvtools::opt::Loop::GetMergingBlocks
          (Loop *this,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *merging_blocks)

{
  BasicBlock *this_00;
  uint32_t *puVar1;
  bool bVar2;
  uint32_t uVar3;
  CFG *this_01;
  _Elt_pointer ppBVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar5;
  size_type sVar6;
  value_type *__v;
  uint32_t *puVar7;
  uint32_t pred_id;
  stack<const_spvtools::opt::BasicBlock_*,_std::deque<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>_>
  to_visit;
  uint32_t local_8c;
  BasicBlock *local_88;
  _Deque_base<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>
  local_80;
  
  if (this->loop_merge_ != (BasicBlock *)0x0) {
    this_01 = IRContext::cfg(this->context_);
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::clear(&merging_blocks->_M_h);
    std::
    stack<spvtools::opt::BasicBlock_const*,std::deque<spvtools::opt::BasicBlock_const*,std::allocator<spvtools::opt::BasicBlock_const*>>>
    ::
    stack<std::deque<spvtools::opt::BasicBlock_const*,std::allocator<spvtools::opt::BasicBlock_const*>>,void>
              ((stack<const_spvtools::opt::BasicBlock_*,_std::deque<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>_>
                *)&local_80);
    local_88 = this->loop_merge_;
    std::deque<spvtools::opt::BasicBlock_const*,std::allocator<spvtools::opt::BasicBlock_const*>>::
    emplace_back<spvtools::opt::BasicBlock_const*>
              ((deque<spvtools::opt::BasicBlock_const*,std::allocator<spvtools::opt::BasicBlock_const*>>
                *)&local_80,&local_88);
    while (local_80._M_impl.super__Deque_impl_data._M_finish._M_cur !=
           local_80._M_impl.super__Deque_impl_data._M_start._M_cur) {
      ppBVar4 = local_80._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (local_80._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_80._M_impl.super__Deque_impl_data._M_finish._M_first) {
        ppBVar4 = local_80._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      this_00 = ppBVar4[-1];
      std::
      deque<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>::
      pop_back((deque<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>
                *)&local_80);
      uVar3 = BasicBlock::id(this_00);
      local_88 = (BasicBlock *)CONCAT44(local_88._4_4_,uVar3);
      std::__detail::
      _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
      ::insert((__ireturn_type *)merging_blocks,
               (_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                *)&local_88,__v);
      uVar3 = BasicBlock::id(this_00);
      pvVar5 = CFG::preds(this_01,uVar3);
      puVar1 = (pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (puVar7 = (pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start; puVar7 != puVar1; puVar7 = puVar7 + 1)
      {
        local_8c = *puVar7;
        bVar2 = IsInsideLoop(this,local_8c);
        if (!bVar2) {
          sVar6 = std::
                  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::count(&merging_blocks->_M_h,&local_8c);
          if (sVar6 == 0) {
            local_88 = CFG::block(this_01,local_8c);
            std::
            deque<spvtools::opt::BasicBlock_const*,std::allocator<spvtools::opt::BasicBlock_const*>>
            ::emplace_back<spvtools::opt::BasicBlock_const*>
                      ((deque<spvtools::opt::BasicBlock_const*,std::allocator<spvtools::opt::BasicBlock_const*>>
                        *)&local_80,&local_88);
          }
        }
      }
    }
    std::
    _Deque_base<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>
    ::~_Deque_base(&local_80);
    return;
  }
  __assert_fail("GetMergeBlock() && \"This loop is not structured\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_descriptor.cpp"
                ,0x170,
                "void spvtools::opt::Loop::GetMergingBlocks(std::unordered_set<uint32_t> *) const");
}

Assistant:

void Loop::GetMergingBlocks(
    std::unordered_set<uint32_t>* merging_blocks) const {
  assert(GetMergeBlock() && "This loop is not structured");
  CFG* cfg = context_->cfg();
  merging_blocks->clear();

  std::stack<const BasicBlock*> to_visit;
  to_visit.push(GetMergeBlock());
  while (!to_visit.empty()) {
    const BasicBlock* bb = to_visit.top();
    to_visit.pop();
    merging_blocks->insert(bb->id());
    for (uint32_t pred_id : cfg->preds(bb->id())) {
      if (!IsInsideLoop(pred_id) && !merging_blocks->count(pred_id)) {
        to_visit.push(cfg->block(pred_id));
      }
    }
  }
}